

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.cpp
# Opt level: O0

uint crnlib::utils::compute_max_mips(uint width,uint height)

{
  uint num_mips;
  uint height_local;
  uint width_local;
  uint local_4;
  
  if (width == 0 && height == 0) {
    local_4 = 0;
  }
  else {
    num_mips = 1;
    height_local = height;
    for (width_local = width; 1 < width_local || 1 < height_local; width_local = width_local >> 1) {
      height_local = height_local >> 1;
      num_mips = num_mips + 1;
    }
    local_4 = num_mips;
  }
  return local_4;
}

Assistant:

uint compute_max_mips(uint width, uint height) {
  if ((width | height) == 0)
    return 0;

  uint num_mips = 1;

  while ((width > 1U) || (height > 1U)) {
    width >>= 1U;
    height >>= 1U;
    num_mips++;
  }

  return num_mips;
}